

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack26_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar15 [32];
  
  auVar10 = *(undefined1 (*) [16])(in + 1);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x18120c06));
  uVar3 = *in;
  uVar1 = *(ulong *)(in + 6);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1;
  auVar16 = vpsllvd_avx2(auVar20,_DAT_001aa700);
  auVar8._8_8_ = 0x3ff000003fffc00;
  auVar8._0_8_ = 0x3ff000003fffc00;
  auVar8 = vpandq_avx512vl(auVar16,auVar8);
  *out = uVar3 & 0x3ffffff;
  auVar16 = vpsllvd_avx2(auVar10,auVar6);
  auVar11 = valignd_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar10),7);
  auVar10 = vpand_avx(auVar16,_DAT_0019dba0);
  auVar12 = vpbroadcastd_avx512vl();
  auVar13 = vpblendd_avx2(auVar11,ZEXT432(uVar3),1);
  auVar11 = vpmovsxbd_avx2(ZEXT816(0xe040403020100));
  auVar11 = vpermi2d_avx512vl(auVar11,auVar13,auVar12);
  uVar19 = (undefined4)uVar1;
  auVar12._4_4_ = uVar19;
  auVar12._0_4_ = uVar19;
  auVar12._8_4_ = uVar19;
  auVar12._12_4_ = uVar19;
  auVar12._16_4_ = uVar19;
  auVar12._20_4_ = uVar19;
  auVar12._24_4_ = uVar19;
  auVar12._28_4_ = uVar19;
  auVar13 = vpbroadcastd_avx512vl();
  uVar3 = in[8];
  auVar11 = vpblendd_avx2(auVar11,auVar12,0x80);
  auVar12 = vpsrlvd_avx2(auVar11,_DAT_0019a700);
  auVar14._8_4_ = 0x3ffffff;
  auVar14._0_8_ = 0x3ffffff03ffffff;
  auVar14._12_4_ = 0x3ffffff;
  auVar15._16_4_ = 0x3ffffff;
  auVar15._0_16_ = auVar14;
  auVar15._20_4_ = 0x3ffffff;
  auVar15._24_4_ = 0x3ffffff;
  auVar15._28_4_ = 0x3ffffff;
  auVar11 = vpblendd_avx2(ZEXT1632(auVar10),auVar15,0x10);
  auVar11 = vpblendd_avx2(auVar11,auVar13,0x20);
  uVar21 = auVar8._0_8_;
  auVar13._8_8_ = uVar21;
  auVar13._0_8_ = uVar21;
  auVar13._16_8_ = uVar21;
  auVar13._24_8_ = uVar21;
  uVar1 = *(ulong *)(in + 0x12);
  auVar11 = vpblendd_avx2(auVar11,auVar13,0xc0);
  auVar13 = vpor_avx2(auVar12,auVar11);
  auVar11 = vpand_avx2(auVar12,auVar15);
  auVar11 = vpblendd_avx2(auVar13,auVar11,0x10);
  uVar2 = *(ulong *)(in + 9);
  *(undefined1 (*) [32])(out + 1) = auVar11;
  auVar10 = vpshufd_avx(auVar20,0x55);
  auVar16 = vpmovsxbd_avx(ZEXT416(0x4010100));
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar2;
  auVar8 = vpsllvd_avx2(auVar17,_DAT_0019e440);
  auVar10 = vpinsrd_avx(auVar10,uVar3,1);
  auVar9._8_8_ = 0x3ffff0003fffffc;
  auVar9._0_8_ = 0x3ffff0003fffffc;
  auVar9 = vpandq_avx512vl(auVar8,auVar9);
  auVar10 = vpermi2d_avx512vl(auVar16,auVar10,auVar17);
  auVar8 = vpsrlvd_avx2(auVar10,_DAT_0019dbb0);
  auVar10 = vpinsrd_avx(auVar14,(uVar3 & 0xf) << 0x16,0);
  uVar5 = *(ulong *)(in + 0xb);
  auVar10 = vpunpcklqdq_avx(auVar10,auVar9);
  auVar16 = vpor_avx(auVar8,auVar10);
  auVar10 = vpand_avx(auVar8,auVar14);
  auVar16 = vpblendd_avx2(auVar16,auVar10,2);
  auVar10 = vpmovsxbd_avx(ZEXT416(0x401));
  *(undefined1 (*) [16])(out + 9) = auVar16;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar5;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar2;
  auVar10 = vpermi2d_avx512vl(auVar10,auVar18,auVar16);
  auVar8 = vpsrlvd_avx2(auVar10,_DAT_0019d840);
  auVar10 = vpsllvd_avx2(auVar16,_DAT_0019e450);
  auVar16 = vpmovsxbd_avx(ZEXT416(0x2010004));
  auVar7._8_8_ = 0x3f0000003ffc000;
  auVar7._0_8_ = 0x3f0000003ffc000;
  auVar10 = vpternlogq_avx512vl(auVar10,auVar8,auVar7,0xec);
  *(long *)(out + 0xd) = auVar10._0_8_;
  auVar10 = *(undefined1 (*) [16])(in + 0xe);
  out[0xf] = (uint)(uVar5 >> 0x26);
  uVar3 = in[0xd];
  out[0x10] = uVar3 & 0x3ffffff;
  uVar4 = in[0x11];
  auVar8 = vpermi2d_avx512vl(auVar16,auVar10,ZEXT416(uVar3));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar1;
  auVar16 = vpalignr_avx(auVar22,auVar10,0xc);
  auVar10 = vpshldvd_avx512_vbmi2(auVar10,auVar8,auVar6);
  auVar10 = vpand_avx(auVar10,auVar14);
  auVar6 = vpsrlvd_avx2(auVar16,_DAT_001aa440);
  auVar16 = vpsllvd_avx2(auVar22,_DAT_0019d5b0);
  *(undefined1 (*) [16])(out + 0x11) = auVar10;
  out[0x15] = uVar4 >> 2 & 0x3ffffff;
  auVar10._8_8_ = 0x3fffc0003fffff0;
  auVar10._0_8_ = 0x3fffc0003fffff0;
  auVar10 = vpternlogq_avx512vl(auVar16,auVar6,auVar10,0xec);
  *(long *)(out + 0x16) = auVar10._0_8_;
  return in + 0x14;
}

Assistant:

const uint32_t *__fastunpack26_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 10)) << (26 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 4)) << (26 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 26);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 24)) << (26 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 18)) << (26 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 12)) << (26 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 6)) << (26 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;

  return in + 1;
}